

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

void wasm::TypeUpdating::handleNonDefaultableLocals(Function *func,Module *wasm)

{
  __node_base_ptr *this;
  uint index_00;
  Expression **ppEVar1;
  bool bVar2;
  bool bVar3;
  reference pTVar4;
  reference puVar5;
  LocalGet *get_00;
  Expression *pEVar6;
  reference pppEVar7;
  LocalSet *this_00;
  size_type sVar8;
  HeapType heapType;
  RefAs *pRVar9;
  reference puVar10;
  Type TVar11;
  size_t sVar12;
  reference pvVar13;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar14;
  bool local_21b;
  _Node_iterator_base<unsigned_int,_false> _Stack_1b8;
  uint index_1;
  iterator __end2_4;
  iterator __begin2_4;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2_4;
  Type local_198;
  Type local_190;
  Type type_1;
  LocalSet *set;
  Expression **setp;
  iterator __end2_3;
  iterator __begin2_3;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *__range2_3;
  LocalGet *get;
  Expression **getp;
  iterator __end2_2;
  iterator __begin2_2;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *__range2_2;
  Builder builder;
  Type local_f0;
  _Node_iterator_base<unsigned_int,_false> local_e8;
  undefined1 local_e0;
  Index local_c4;
  iterator iStack_c0;
  uint index;
  iterator __end2_1;
  iterator __begin2_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *__range2_1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  badIndexes;
  LocalStructuralDominance info;
  Type type;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range2;
  bool hasNonNullable;
  Module *wasm_local;
  Function *func_local;
  
  bVar2 = FeatureSet::hasGCNNLocals(&wasm->features);
  if ((!bVar2) && (bVar2 = FeatureSet::hasReferenceTypes(&wasm->features), bVar2)) {
    bVar2 = false;
    __end2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(&func->vars);
    type.id = (uintptr_t)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(&func->vars);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                       *)&type), bVar3) {
      pTVar4 = __gnu_cxx::
               __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
               ::operator*(&__end2);
      info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header._M_node_count = pTVar4->id;
      bVar3 = wasm::Type::isNonNullable
                        ((Type *)&info.nonDominatingIndices._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
      if (bVar3) {
        bVar2 = true;
        break;
      }
      __gnu_cxx::
      __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
      operator++(&__end2);
    }
    if (bVar2) {
      LocalStructuralDominance::LocalStructuralDominance
                ((LocalStructuralDominance *)&badIndexes._M_h._M_single_bucket,func,wasm,
                 NonNullableOnly);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&__range2_1);
      this = &badIndexes._M_h._M_single_bucket;
      __end2_1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                 begin((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       this);
      iStack_c0 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      this);
      while (bVar2 = std::operator!=(&__end2_1,&stack0xffffffffffffff40), bVar2) {
        puVar5 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2_1);
        local_c4 = *puVar5;
        pVar14 = std::
                 unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&__range2_1,&local_c4);
        local_e8._M_cur =
             (__node_type *)pVar14.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
        local_e0 = pVar14.second;
        local_f0 = Function::getLocalType(func,local_c4);
        bVar2 = wasm::Type::isNonNullable(&local_f0);
        if (!bVar2) {
          __assert_fail("func->getLocalType(index).isNonNullable()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                        ,0x154,
                        "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)")
          ;
        }
        bVar2 = Function::isParam(func,local_c4);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          __assert_fail("!func->isParam(index)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                        ,0x155,
                        "void wasm::TypeUpdating::handleNonDefaultableLocals(Function *, Module &)")
          ;
        }
        std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2_1);
      }
      bVar2 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::empty((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&__range2_1);
      if (bVar2) {
        builder.wasm._4_4_ = 1;
      }
      else {
        Builder::Builder((Builder *)&__range2_2,wasm);
        FindAllPointers<wasm::LocalGet>::FindAllPointers
                  ((FindAllPointers<wasm::LocalGet> *)&__begin2_2,&func->body);
        __end2_2 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::begin
                             ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                              &__begin2_2);
        getp = (Expression **)
               std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::end
                         ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                          &__begin2_2);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_2,
                                  (__normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                                   *)&getp), bVar2) {
          pppEVar7 = __gnu_cxx::
                     __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                     ::operator*(&__end2_2);
          ppEVar1 = *pppEVar7;
          get_00 = Expression::cast<wasm::LocalGet>(*ppEVar1);
          sVar8 = std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)&__range2_1,&get_00->index);
          if (sVar8 != 0) {
            pEVar6 = fixLocalGet(get_00,wasm);
            *ppEVar1 = pEVar6;
          }
          __gnu_cxx::
          __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
          ::operator++(&__end2_2);
        }
        builder.wasm._4_4_ = 6;
        FindAllPointers<wasm::LocalGet>::~FindAllPointers
                  ((FindAllPointers<wasm::LocalGet> *)&__begin2_2);
        FindAllPointers<wasm::LocalSet>::FindAllPointers
                  ((FindAllPointers<wasm::LocalSet> *)&__begin2_3,&func->body);
        __end2_3 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::begin
                             ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                              &__begin2_3);
        setp = (Expression **)
               std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::end
                         ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                          &__begin2_3);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_3,
                                  (__normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                                   *)&setp), bVar2) {
          pppEVar7 = __gnu_cxx::
                     __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                     ::operator*(&__end2_3);
          ppEVar1 = *pppEVar7;
          this_00 = Expression::cast<wasm::LocalSet>(*ppEVar1);
          bVar2 = Function::isVar(func,this_00->index);
          if (bVar2) {
            bVar2 = LocalSet::isTee(this_00);
            local_21b = true;
            if (bVar2) {
              type_1.id._4_4_ = 1;
              local_21b = wasm::Type::operator==
                                    (&(this_00->super_SpecificExpression<(wasm::Expression::Id)9>).
                                      super_Expression.type,(BasicType *)((long)&type_1.id + 4));
            }
            if ((local_21b == false) &&
               (sVar8 = std::
                        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&__range2_1,&this_00->index), sVar8 != 0)) {
              local_190 = Function::getLocalType(func,this_00->index);
              heapType = wasm::Type::getHeapType(&local_190);
              wasm::Type::Type(&local_198,heapType,Nullable);
              (this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id
                   = local_198.id;
              pRVar9 = Builder::makeRefAs((Builder *)&__range2_2,RefAsNonNull,(Expression *)this_00)
              ;
              *ppEVar1 = (Expression *)pRVar9;
            }
          }
          __gnu_cxx::
          __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
          ::operator++(&__end2_3);
        }
        builder.wasm._4_4_ = 8;
        FindAllPointers<wasm::LocalSet>::~FindAllPointers
                  ((FindAllPointers<wasm::LocalSet> *)&__begin2_3);
        __end2_4 = std::
                   unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&__range2_1);
        _Stack_1b8._M_cur =
             (__node_type *)
             std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&__range2_1);
        while (bVar2 = std::__detail::operator!=
                                 (&__end2_4.super__Node_iterator_base<unsigned_int,_false>,
                                  &stack0xfffffffffffffe48), bVar2) {
          puVar10 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2_4);
          index_00 = *puVar10;
          TVar11 = Function::getLocalType(func,index_00);
          TVar11 = getValidLocalType(TVar11,(FeatureSet)(wasm->features).features);
          sVar12 = Function::getNumParams(func);
          pvVar13 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                              (&func->vars,index_00 - sVar12);
          pvVar13->id = TVar11.id;
          std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2_4);
        }
        builder.wasm._4_4_ = 0;
      }
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&__range2_1);
      LocalStructuralDominance::~LocalStructuralDominance
                ((LocalStructuralDominance *)&badIndexes._M_h._M_single_bucket);
    }
  }
  return;
}

Assistant:

void handleNonDefaultableLocals(Function* func, Module& wasm) {
  if (wasm.features.hasGCNNLocals()) {
    // We have nothing to fix up: all locals are allowed.
    return;
  }
  if (!wasm.features.hasReferenceTypes()) {
    // No references, so no non-nullable ones at all.
    return;
  }
  bool hasNonNullable = false;
  for (auto type : func->vars) {
    if (type.isNonNullable()) {
      hasNonNullable = true;
      break;
    }
  }
  if (!hasNonNullable) {
    // No non-nullable types exist in practice.
    return;
  }

  // Non-nullable locals exist, which we may need to fix up. See if they
  // validate as they are, that is, if they fall within the validation rules of
  // the wasm spec. We do not need to modify such locals.
  LocalStructuralDominance info(
    func, wasm, LocalStructuralDominance::NonNullableOnly);
  std::unordered_set<Index> badIndexes;
  for (auto index : info.nonDominatingIndices) {
    badIndexes.insert(index);

    // LocalStructuralDominance should have only looked at non-nullable indexes
    // since we told it to ignore nullable ones. Also, params always dominate
    // and should not appear here.
    assert(func->getLocalType(index).isNonNullable());
    assert(!func->isParam(index));
  }
  if (badIndexes.empty()) {
    return;
  }

  // Rewrite the local.gets.
  Builder builder(wasm);
  for (auto** getp : FindAllPointers<LocalGet>(func->body).list) {
    auto* get = (*getp)->cast<LocalGet>();
    if (badIndexes.count(get->index)) {
      *getp = fixLocalGet(get, wasm);
    }
  }

  // Update tees, whose type must match the local (if the wasm spec changes for
  // the type to be that of the value, then this can be removed).
  for (auto** setp : FindAllPointers<LocalSet>(func->body).list) {
    auto* set = (*setp)->cast<LocalSet>();
    if (!func->isVar(set->index)) {
      // We do not need to process params, which can legally be non-nullable.
      continue;
    }
    // Non-tees do not change, and unreachable tees can be ignored here as their
    // type is unreachable anyhow.
    if (!set->isTee() || set->type == Type::unreachable) {
      continue;
    }
    if (badIndexes.count(set->index)) {
      auto type = func->getLocalType(set->index);
      set->type = Type(type.getHeapType(), Nullable);
      *setp = builder.makeRefAs(RefAsNonNull, set);
    }
  }

  // Rewrite the types of the function's vars (which we can do now, after we
  // are done using them to know which local.gets etc to fix).
  for (auto index : badIndexes) {
    func->vars[index - func->getNumParams()] =
      getValidLocalType(func->getLocalType(index), wasm.features);
  }
}